

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall
FlowGraph::RemoveBlock(FlowGraph *this,BasicBlock *block,GlobOpt *globOpt,bool tailDuping)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *this_00;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *this_01;
  BasicBlock *pBVar1;
  Instr *pIVar2;
  Loop *pLVar3;
  code *pcVar4;
  Loop **ppLVar5;
  bool bVar6;
  undefined4 *puVar7;
  Type *ppFVar8;
  Loop **ppLVar9;
  long lVar10;
  Func **ppFVar11;
  long lVar12;
  Instr *instr;
  Instr *pIVar13;
  undefined1 local_48 [8];
  Iterator __iter;
  
  __iter.current = (NodeBase *)this;
  if ((block->field_0x18 & 3) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd34,"(!block->isDead && !block->isDeleted)",
                       "!block->isDead && !block->isDeleted");
    if (!bVar6) {
LAB_00414000:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  pBVar1 = block->next;
  ppFVar11 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar11 = &block->func;
  }
  lVar12 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar12 = 0xd0;
  }
  lVar10 = 0x18;
  if (*(long *)((long)&(*ppFVar11)->m_alloc + lVar12) == 0) {
    pIVar13 = (Instr *)0x0;
  }
  else {
    ppFVar11 = (Func **)&pBVar1->firstInstr;
    if (pBVar1 == (BasicBlock *)0x0) {
      lVar10 = 0xd0;
      ppFVar11 = &block->func;
    }
    pIVar13 = *(Instr **)(*(long *)((long)&(*ppFVar11)->m_alloc + lVar10) + 0x10);
  }
  instr = block->firstInstr;
  if (instr != pIVar13) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (instr->m_opcode == FunctionExit) break;
      pIVar2 = instr->m_next;
      if (instr == block->firstInstr) {
        if ((instr->m_kind != InstrKindLabel) && (instr->m_kind != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0xd41,"(instr->IsLabelInstr())","instr->IsLabelInstr()");
          if (!bVar6) goto LAB_00414000;
          *puVar7 = 0;
        }
        if ((instr->m_kind != InstrKindLabel) && (instr->m_kind != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar6) goto LAB_00414000;
          *puVar7 = 0;
        }
        *(byte *)&instr[1].m_func = *(byte *)&instr[1].m_func & 0xfe;
        if ((instr->m_kind != InstrKindLabel) && (instr->m_kind != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar6) goto LAB_00414000;
          *puVar7 = 0;
        }
        *(byte *)&instr[1].m_func = *(byte *)&instr[1].m_func & 0xfb;
      }
      else {
        RemoveInstr((FlowGraph *)__iter.current,instr,globOpt);
      }
      instr = pIVar2;
    } while (pIVar2 != pIVar13);
  }
  this_00 = &block->predList;
  local_48 = (undefined1  [8])this_00;
  __iter.list = &this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) goto LAB_00414000;
      *puVar7 = 0;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_48) break;
    ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_48);
    BasicBlock::RemoveSucc
              ((*ppFVar8)->predBlock,block,(FlowGraph *)__iter.current,false,
               globOpt != (GlobOpt *)0x0);
  }
  this_01 = &block->succList;
  local_48 = (undefined1  [8])this_01;
  __iter.list = &this_01->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) goto LAB_00414000;
      *puVar7 = 0;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_48) {
      if (((block->field_0x18 & 4) != 0) && (__iter.current[3].next != (Type)0x0)) {
        ppLVar5 = (Loop **)(__iter.current + 3);
        do {
          ppLVar9 = ppLVar5;
          pLVar3 = *ppLVar9;
          ppLVar5 = &pLVar3->next;
        } while (pLVar3 != block->loop);
        *ppLVar9 = pLVar3->next;
        *(bool *)((long)&__iter.current[9].next + 1) = __iter.current[3].next != (Type)0x0;
      }
      if (globOpt != (GlobOpt *)0x0) {
        block->field_0x18 = block->field_0x18 | 2;
        __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
            (block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next != this_00) {
          do {
            SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::MoveHeadTo
                      (&this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>,
                       &(block->deadPredList).
                        super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          } while ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
                   (this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListNodeBase<Memory::ArenaAllocator>.next != this_00);
        }
        if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
            (block->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next != this_01) {
          do {
            SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::MoveHeadTo
                      (&this_01->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>,
                       &(block->deadSuccList).
                        super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
          } while ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
                   (this_01->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListNodeBase<Memory::ArenaAllocator>.next != this_01);
        }
      }
      if (tailDuping) {
        block->field_0x18 = block->field_0x18 | 2;
      }
      block->field_0x18 = block->field_0x18 | 1;
      block->dataUseCount = 0;
      return;
    }
    ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_48);
    BasicBlock::RemovePred
              ((*ppFVar8)->succBlock,block,(FlowGraph *)__iter.current,false,
               globOpt != (GlobOpt *)0x0);
  } while( true );
}

Assistant:

void
FlowGraph::RemoveBlock(BasicBlock *block, GlobOpt * globOpt, bool tailDuping)
{
    Assert(!block->isDead && !block->isDeleted);
    IR::Instr * lastInstr = nullptr;
    FOREACH_INSTR_IN_BLOCK_EDITING(instr, instrNext, block)
    {
        if (instr->m_opcode == Js::OpCode::FunctionExit)
        {
            // Removing FunctionExit causes problems downstream...
            // We could change the opcode, or have FunctionEpilog/FunctionExit to get
            // rid of the epilog.
            break;
        }
        if (instr == block->GetFirstInstr())
        {
            Assert(instr->IsLabelInstr());
            instr->AsLabelInstr()->m_isLoopTop = false;
            instr->AsLabelInstr()->m_hasNonBranchRef = false;
        }
        else
        {
            lastInstr = this->RemoveInstr(instr, globOpt);
        }
    } NEXT_INSTR_IN_BLOCK_EDITING;

    if (lastInstr)
    {
        block->SetLastInstr(lastInstr);
    }
    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, block->GetPredList())
    {
        edge->GetPred()->RemoveSucc(block, this, false, globOpt != nullptr);
    } NEXT_SLISTBASECOUNTED_ENTRY;

    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, block->GetSuccList())
    {
        edge->GetSucc()->RemovePred(block, this, false, globOpt != nullptr);
    } NEXT_SLISTBASECOUNTED_ENTRY;

    if (block->isLoopHeader && this->loopList)
    {
        // If loop graph is built, remove loop from loopList
        Loop **pPrevLoop = &this->loopList;

        while (*pPrevLoop != block->loop)
        {
            pPrevLoop = &((*pPrevLoop)->next);
        }
        *pPrevLoop = (*pPrevLoop)->next;
        this->hasLoop = (this->loopList != nullptr);
    }
    if (globOpt != nullptr)
    {
        block->isDead = true;
        block->GetPredList()->MoveTo(block->GetDeadPredList());
        block->GetSuccList()->MoveTo(block->GetDeadSuccList());
    }
    if (tailDuping)
    {
        block->isDead = true;
    }
    block->isDeleted = true;
    block->SetDataUseCount(0);
}